

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
AActor::LinkToWorld(AActor *this,FLinkContext *ctx,bool spawningmapthing,sector_t *sector)

{
  double dVar1;
  undefined1 auVar2 [16];
  AActor *pAVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  subsector_t *psVar10;
  msecnode_t *pmVar11;
  WORD *pWVar12;
  FBlockNode *pFVar13;
  int iVar14;
  FBlockNode *pFVar15;
  undefined7 in_register_00000011;
  uint uVar16;
  FBlockNode **ppFVar17;
  int y;
  int y_00;
  int x;
  FBlockNode **ppFVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  FPortalGroupArray check;
  undefined1 local_48 [16];
  double local_38;
  
  if ((((int)CONCAT71(in_register_00000011,spawningmapthing) == 0) || (sector != (sector_t *)0x0))
     || (((this->flags4).Value & 0x40) == 0)) {
    cVar7 = spawningmapthing;
    if (sector != (sector_t *)0x0) goto LAB_004211c0;
  }
  else {
    bVar6 = FixMapthingPos(this);
    cVar7 = !bVar6;
  }
  if ((cVar7 == '\0') || (numgamenodes == 0)) {
    check._0_8_ = (this->__Pos).X;
    check.entry = (WORD  [4])(this->__Pos).Y;
    sector = (sector_t *)P_PointInSector((DVector2 *)&check);
  }
  else {
    sector = P_PointInSectorBuggy((this->__Pos).X,(this->__Pos).Y);
  }
LAB_004211c0:
  this->Sector = sector;
  check._0_8_ = (this->__Pos).X;
  check.entry = (WORD  [4])(this->__Pos).Y;
  psVar10 = R_PointInSubsector((DVector2 *)&check);
  this->subsector = psVar10;
  if (((this->flags).Value & 8) == 0) {
    pAVar3 = ((sector_t_conflict *)sector)->thinglist;
    this->snext = pAVar3;
    if (pAVar3 != (AActor *)0x0) {
      pAVar3->sprev = &this->snext;
    }
    this->sprev = &((sector_t_conflict *)sector)->thinglist;
    ((sector_t_conflict *)sector)->thinglist = this;
    if (ctx == (FLinkContext *)0x0) {
      pmVar11 = (msecnode_t *)0x0;
    }
    else {
      pmVar11 = ctx->sector_list;
    }
    pmVar11 = P_CreateSecNodeList(this,this->radius,pmVar11,0x1c0);
    this->touching_sectorlist = pmVar11;
    auVar2._0_8_ = this->renderradius;
    if (0.0 <= auVar2._0_8_) {
      dVar1 = this->radius;
      uVar19 = SUB84(dVar1,0);
      uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
      if (dVar1 <= auVar2._0_8_) {
        uVar19 = SUB84(auVar2._0_8_,0);
        uVar20 = (undefined4)((ulong)auVar2._0_8_ >> 0x20);
      }
      if (ctx == (FLinkContext *)0x0) {
        pmVar11 = (msecnode_t *)0x0;
      }
      else {
        pmVar11 = ctx->render_list;
      }
      pmVar11 = P_CreateSecNodeList(this,(double)CONCAT44(uVar20,uVar19),pmVar11,0x1d0);
      this->touching_rendersectors = pmVar11;
    }
    else {
      this->touching_rendersectors = (msecnode_t *)0x0;
      if (ctx != (FLinkContext *)0x0) {
        P_DelSeclist(ctx->render_list,0x1d0);
      }
    }
  }
  if (((this->flags).Value & 0x10) == 0) {
    check.data.Array = (unsigned_short *)0x0;
    check.data.Most = 0;
    check.data.Count = 0;
    check.method = 1;
    check.varused = '\0';
    check._0_8_ = check._0_8_ & 0xffffffffffffff00;
    local_48._0_8_ = (this->__Pos).X;
    local_48._8_8_ = (this->__Pos).Y;
    local_38 = (this->__Pos).Z;
    P_CollectConnectedGroups
              (this->Sector->PortalGroup,(DVector3 *)local_48,local_38 + this->Height,this->radius,
               &check);
    ppFVar18 = &this->BlockNode;
    this->BlockNode = (FBlockNode *)0x0;
    uVar8 = 0xffffffff;
    while ((int)uVar8 < (int)(check.varused + check.data.Count)) {
      uVar16 = uVar8 + 1;
      if (uVar16 == 0) {
        auVar2._0_8_ = (this->__Pos).X;
        auVar2._8_8_ = (this->__Pos).Y;
        local_48 = auVar2;
        local_38 = (this->__Pos).Z;
        uVar19 = (undefined4)auVar2._8_8_;
        uVar20 = (undefined4)((ulong)auVar2._8_8_ >> 0x20);
      }
      else {
        pWVar12 = check.entry + uVar8;
        if (3 < uVar8) {
          pWVar12 = check.data.Array + (uVar8 - 4);
        }
        PosRelative((DVector3 *)local_48,this,*pWVar12 & 0x3fff);
        uVar19 = local_48._8_4_;
        uVar20 = local_48._12_4_;
        auVar2._0_8_ = (double)local_48._0_8_;
      }
      dVar1 = this->radius;
      iVar14 = (int)(((auVar2._0_8_ - dVar1) - bmaporgx) * 0.0078125);
      uVar8 = uVar16;
      if ((iVar14 < bmapwidth) &&
         (iVar9 = (int)(((auVar2._0_8_ + dVar1) - bmaporgx) * 0.0078125), -1 < iVar9)) {
        uVar16 = (uint)(((dVar1 + (double)CONCAT44(uVar20,uVar19)) - bmaporgy) * 0.0078125);
        pFVar15 = (FBlockNode *)(ulong)uVar16;
        if ((-1 < (int)uVar16) &&
           (y_00 = (int)((((double)CONCAT44(uVar20,uVar19) - dVar1) - bmaporgy) * 0.0078125),
           y_00 < bmapheight)) {
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          if (y_00 < 1) {
            y_00 = 0;
          }
          iVar4 = bmapwidth + -1;
          if (iVar9 <= bmapwidth + -1) {
            iVar4 = iVar9;
          }
          uVar5 = bmapheight - 1U;
          if ((int)uVar16 <= (int)(bmapheight - 1U)) {
            uVar5 = uVar16;
          }
          for (; iVar9 = iVar14, y_00 <= (int)uVar5; y_00 = y_00 + 1) {
            for (; iVar9 <= iVar4; iVar9 = iVar9 + 1) {
              ppFVar17 = blocklinks + (bmapwidth * y_00 + iVar9);
              pFVar13 = FBlockNode::Create(this,iVar9,y_00,(int)pFVar15);
              pFVar15 = *ppFVar17;
              pFVar13->NextActor = pFVar15;
              if (pFVar15 != (FBlockNode *)0x0) {
                pFVar15->PrevActor = &pFVar13->NextActor;
              }
              pFVar13->PrevActor = ppFVar17;
              *ppFVar17 = pFVar13;
              pFVar13->PrevBlock = ppFVar18;
              pFVar13->NextBlock = (FBlockNode *)0x0;
              *ppFVar18 = pFVar13;
              ppFVar18 = &pFVar13->NextBlock;
            }
          }
        }
      }
    }
    TArray<unsigned_short,_unsigned_short>::~TArray(&check.data);
  }
  if (!spawningmapthing) {
    UpdateRenderSectorList(this);
  }
  return;
}

Assistant:

void AActor::LinkToWorld(FLinkContext *ctx, bool spawningmapthing, sector_t *sector)
{
	bool spawning = spawningmapthing;

	if (spawning)
	{
		if ((flags4 & MF4_FIXMAPTHINGPOS) && sector == NULL)
		{
			if (FixMapthingPos()) spawning = false;
		}
	}

	if (sector == NULL)
	{
		if (!spawning || numgamenodes == 0)
		{
			sector = P_PointInSector(Pos());
		}
		else
		{
			sector = P_PointInSectorBuggy(X(), Y());
		}
	}

	Sector = sector;
	subsector = R_PointInSubsector(Pos());	// this is from the rendering nodes, not the gameplay nodes!

	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't go into the sector links
		// killough 8/11/98: simpler scheme using pointer-to-pointer prev
		// pointers, allows head nodes to be treated like everything else

		AActor **link = &sector->thinglist;
		AActor *next = *link;
		if ((snext = next))
			next->sprev = &snext;
		sprev = link;
		*link = this;

		// phares 3/16/98
		//
		// If sector_list isn't NULL, it has a collection of sector
		// nodes that were just removed from this Thing.

		// Collect the sectors the object will live in by looking at
		// the existing sector_list and adding new nodes and deleting
		// obsolete ones.

		// When a node is deleted, its sector links (the links starting
		// at sector_t->touching_thinglist) are broken. When a node is
		// added, new sector links are created.
		touching_sectorlist = P_CreateSecNodeList(this, radius, ctx != nullptr? ctx->sector_list : nullptr, &sector_t::touching_thinglist);	// Attach to thing
		if (renderradius >= 0) touching_rendersectors = P_CreateSecNodeList(this, MAX(radius, renderradius), ctx != nullptr ? ctx->render_list : nullptr, &sector_t::touching_renderthings);
		else
		{
			touching_rendersectors = nullptr;
			if (ctx != nullptr) P_DelSeclist(ctx->render_list, &sector_t::touching_renderthings);
		}
	}


	// link into blockmap (inert things don't need to be in the blockmap)
	if (!(flags & MF_NOBLOCKMAP))
	{
		FPortalGroupArray check;

		P_CollectConnectedGroups(Sector->PortalGroup, Pos(), Top(), radius, check);

		BlockNode = NULL;
		FBlockNode **alink = &this->BlockNode;
		for (int i = -1; i < (int)check.Size(); i++)
		{
			DVector3 pos = i==-1? Pos() : PosRelative(check[i] & ~FPortalGroupArray::FLAT);

			int x1 = GetBlockX(pos.X - radius);
			int x2 = GetBlockX(pos.X + radius);
			int y1 = GetBlockY(pos.Y - radius);
			int y2 = GetBlockY(pos.Y + radius);

			if (x1 >= bmapwidth || x2 < 0 || y1 >= bmapheight || y2 < 0)
			{ // thing is off the map
			}
			else
			{ // [RH] Link into every block this actor touches, not just the center one
				x1 = MAX(0, x1);
				y1 = MAX(0, y1);
				x2 = MIN(bmapwidth - 1, x2);
				y2 = MIN(bmapheight - 1, y2);
				for (int y = y1; y <= y2; ++y)
				{
					for (int x = x1; x <= x2; ++x)
					{
						FBlockNode **link = &blocklinks[y*bmapwidth + x];
						FBlockNode *node = FBlockNode::Create(this, x, y, this->Sector->PortalGroup);

						// Link in to block
						if ((node->NextActor = *link) != NULL)
						{
							(*link)->PrevActor = &node->NextActor;
						}
						node->PrevActor = link;
						*link = node;

						// Link in to actor
						node->PrevBlock = alink;
						node->NextBlock = NULL;
						(*alink) = node;
						alink = &node->NextBlock;
					}
				}
			}
		}
	}
	// Portal links cannot be done unless the level is fully initialized.
	if (!spawningmapthing) UpdateRenderSectorList();
}